

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,bool forceOpt)

{
  bool exclude_from_all;
  bool bVar1;
  MessageLevel message_00;
  cmMakefile *mf;
  cmInstallTargetGenerator *this;
  string *targetName;
  char *dest;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  undefined1 local_9a;
  MessageLevel message;
  bool forceOpt_local;
  bool impLib_local;
  cmInstallCommandArguments *args_local;
  cmTarget *target_local;
  
  mf = cmTarget::GetMakefile(target);
  message_00 = cmInstallGenerator::SelectMessageLevel(mf,false);
  cmTarget::SetHaveInstallRule(target,true);
  this = (cmInstallTargetGenerator *)operator_new(0x108);
  targetName = cmTarget::GetName_abi_cxx11_(target);
  cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
  dest = (char *)std::__cxx11::string::c_str();
  cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (char *)std::__cxx11::string::c_str();
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  component = (char *)std::__cxx11::string::c_str();
  exclude_from_all = cmInstallCommandArguments::GetExcludeFromAll(args);
  bVar1 = cmInstallCommandArguments::GetOptional(args);
  local_9a = 1;
  if (!bVar1) {
    local_9a = forceOpt;
  }
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,targetName,dest,impLib,file_permissions,configurations,component,message_00,
             exclude_from_all,(bool)(local_9a & 1));
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(
  cmTarget& target, const cmInstallCommandArguments& args, bool impLib,
  bool forceOpt = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  return new cmInstallTargetGenerator(
    target.GetName(), args.GetDestination().c_str(), impLib,
    args.GetPermissions().c_str(), args.GetConfigurations(),
    args.GetComponent().c_str(), message, args.GetExcludeFromAll(),
    args.GetOptional() || forceOpt);
}